

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collate.cpp
# Opt level: O3

int __thiscall
booster::locale::impl_posix::collator<char>::do_compare
          (collator<char> *this,char_type *lb,char_type *le,char_type *rb,char_type *re)

{
  char *pcVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  string_type left;
  string_type right;
  char *local_68 [2];
  char local_58 [16];
  char *local_48 [2];
  char local_38 [16];
  
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68);
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,rb,re);
  pcVar1 = local_48[0];
  pcVar4 = local_68[0];
  iVar2 = strcoll_l(local_68[0],local_48[0],
                    (__locale_t)
                    *(this->lc_).super___shared_ptr<__locale_struct_*,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  if (pcVar1 != local_38) {
    operator_delete(pcVar1);
    pcVar4 = local_68[0];
  }
  if (pcVar4 != local_58) {
    operator_delete(pcVar4);
  }
  uVar3 = 0xffffffff;
  if (-1 < iVar2) {
    uVar3 = (uint)(iVar2 != 0);
  }
  return uVar3;
}

Assistant:

virtual int do_compare(char_type const *lb,char_type const *le,char_type const *rb,char_type const *re) const
    {
        string_type left(lb,le-lb);
        string_type right(rb,re-rb);
        int res = coll_traits<char_type>::coll(left.c_str(),right.c_str(),*lc_);
        if(res < 0)
            return -1;
        if(res > 0)
            return 1;
        return 0;
    }